

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_fee.cpp
# Opt level: O0

undefined1  [16] __thiscall cfd::FeeCalculator::GetFee(FeeCalculator *this,uint32_t size)

{
  long lVar1;
  uint in_ESI;
  uint *in_RDI;
  undefined1 auVar2 [16];
  int64_t fee;
  int64_t temp_fee;
  int64_t byte_size;
  undefined8 local_38;
  
  lVar1 = (ulong)*in_RDI * (ulong)in_ESI;
  local_38 = lVar1 / 1000;
  if (lVar1 % 1000 != 0) {
    local_38 = local_38 + 1;
  }
  if (((local_38 == 0) && ((ulong)in_ESI != 0)) && (*in_RDI != 0)) {
    local_38 = 1;
  }
  auVar2 = cfd::core::Amount::CreateBySatoshiAmount(local_38);
  return auVar2;
}

Assistant:

Amount FeeCalculator::GetFee(uint32_t size) const {
  int64_t byte_size = static_cast<int64_t>(size);
  int64_t temp_fee = baserate_ * byte_size;
  int64_t fee = temp_fee / 1000;

  // Round up
  if ((temp_fee % 1000) != 0) ++fee;

  if ((fee == 0) && (byte_size != 0) && (baserate_ != 0)) {
    fee = 1;
  }
  return Amount::CreateBySatoshiAmount(fee);
}